

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)6,(moira::Mode)8,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  undefined8 in_RAX;
  bool bVar2;
  uint val;
  uint uVar3;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar3 = (uint)(this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)8,(moira::Size)2,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,&local_21);
  if (local_21 == false) {
    val = uVar1 + uVar3;
    bVar2 = (bool)((byte)(val >> 0x10) & 1);
    (this->reg).sr.c = bVar2;
    (this->reg).sr.x = bVar2;
    (this->reg).sr.v = (bool)((byte)(((uVar1 ^ val) & (uVar3 ^ val)) >> 0xf) & 1);
    (this->reg).sr.z = (short)val == 0;
    (this->reg).sr.n = (bool)((byte)(val >> 0xf) & 1);
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,val);
  }
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}